

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

RPCHelpMan * echoipc(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  string name;
  string m_key_name;
  RPCResult result;
  string description;
  Fallback fallback;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_00;
  RPCArgOptions opts;
  undefined1 auVar3 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined8 uVar5;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffffb48;
  undefined8 in_stack_fffffffffffffb58;
  undefined8 in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  code *pcVar6;
  undefined8 in_stack_fffffffffffffb70;
  pointer in_stack_fffffffffffffb78;
  pointer pRVar7;
  pointer in_stack_fffffffffffffb80;
  pointer pRVar8;
  pointer in_stack_fffffffffffffb88;
  pointer pRVar9;
  undefined1 in_stack_fffffffffffffb90 [16];
  _Vector_impl_data in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffbb8 [16];
  pointer in_stack_fffffffffffffbc8;
  _Alloc_hider in_stack_fffffffffffffbd0;
  _Alloc_hider _Var10;
  size_type in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  _Alloc_hider in_stack_fffffffffffffbf0;
  _Alloc_hider _Var11;
  size_type in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  _Alloc_hider in_stack_fffffffffffffc10;
  size_type in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  string local_3d0;
  string local_3b0;
  string local_390;
  ulong *local_370;
  undefined8 local_368;
  ulong local_360;
  undefined8 uStack_358;
  ulong *local_350;
  size_type local_348;
  ulong local_340;
  undefined8 uStack_338;
  long *local_330 [2];
  long local_320 [2];
  long *local_310 [2];
  long local_300 [2];
  RPCResult local_2f0;
  undefined1 local_268;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined1 local_240 [32];
  long *local_220 [2];
  long local_210 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"echoipc","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nEcho back the input argument, passing it through a spawned process in a multiprocess build.\nThis command is for testing.\n"
             ,"");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"arg","");
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a8 = 0;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"The string to echo","");
  local_260 = &local_250;
  local_268 = 0;
  local_258 = 0;
  local_250 = 0;
  local_240._0_8_ = (pointer)0x0;
  local_240._8_2_ = 0;
  local_240._10_6_ = 0;
  local_240._16_2_ = 0;
  local_240._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb48;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffffb58;
  name.field_2._8_8_ = in_stack_fffffffffffffb60;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffffb70;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffffb68;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffffb78;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffffb80;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffffb88;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffffb90;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffffba0._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffffba0._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffffba0._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffffbb8;
  description_00._M_string_length = (size_type)in_stack_fffffffffffffbd0._M_p;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbc8;
  description_00.field_2._M_allocated_capacity = in_stack_fffffffffffffbd8;
  description_00.field_2._8_8_ = in_stack_fffffffffffffbe0;
  opts.oneline_description._M_dataplus._M_p = in_stack_fffffffffffffbf0._M_p;
  opts._0_8_ = in_stack_fffffffffffffbe8;
  opts.oneline_description._M_string_length = in_stack_fffffffffffffbf8;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffffc00;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffffc08;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc10._M_p;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc18;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffc20;
  opts.hidden = (bool)(char)in_stack_fffffffffffffc28;
  opts.also_positional = (bool)(char)((ulong)in_stack_fffffffffffffc28 >> 8);
  opts._66_6_ = (int6)((ulong)in_stack_fffffffffffffc28 >> 0x10);
  RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_00,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffbb8,__l,
             (allocator_type *)&stack0xfffffffffffffbb7);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"echo","");
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"The echoed string.","");
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb48;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffb58;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffb60;
  auVar3._16_8_ = 0;
  auVar3._0_16_ = in_stack_fffffffffffffb90;
  RPCResult::RPCResult
            (&local_2f0,STR,m_key_name,
             (string)ZEXT1632(CONCAT88(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68)),
             (vector<RPCResult,_std::allocator<RPCResult>_>)(auVar3 << 0x40),SUB81(local_310,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffffb48;
  result.m_key_name._M_string_length = in_stack_fffffffffffffb58;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffb60;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffb68;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb70;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar7;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar8;
  result._64_8_ = pRVar9;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb90._0_8_;
  result.m_description._M_string_length = in_stack_fffffffffffffb90._8_8_;
  result._88_24_ = in_stack_fffffffffffffba0;
  result.m_cond._8_16_ = in_stack_fffffffffffffbb8;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffffbc8;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffb98,result);
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"echo","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"\"Hello world\"","");
  HelpExampleCli(&local_390,&local_3b0,&local_3d0);
  _Var11._M_p = &stack0xfffffffffffffc00;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffbf0,"echo","");
  _Var10._M_p = &stack0xfffffffffffffbe0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffbd0,"\"Hello world\"","");
  HelpExampleRpc((string *)&stack0xfffffffffffffc10,(string *)&stack0xfffffffffffffbf0,
                 (string *)&stack0xfffffffffffffbd0);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    uVar5 = local_390.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < in_stack_fffffffffffffc18 + local_390._M_string_length) {
    uVar5 = 0xf;
    if (in_stack_fffffffffffffc10._M_p != &stack0xfffffffffffffc20) {
      uVar5 = in_stack_fffffffffffffc20;
    }
    if (in_stack_fffffffffffffc18 + local_390._M_string_length <= (ulong)uVar5) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffc10,0,0,local_390._M_dataplus._M_p,
                       local_390._M_string_length);
      goto LAB_00a68a58;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_390,in_stack_fffffffffffffc10._M_p,in_stack_fffffffffffffc18);
LAB_00a68a58:
  local_370 = &local_360;
  puVar2 = (ulong *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_360 = paVar1->_M_allocated_capacity;
    uStack_358 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_360 = paVar1->_M_allocated_capacity;
    local_370 = puVar2;
  }
  local_348 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_370 == &local_360) {
    uStack_338 = uStack_358;
    local_350 = &local_340;
  }
  else {
    local_350 = local_370;
  }
  local_340 = local_360;
  local_368 = 0;
  local_360 = local_360 & 0xffffffffffffff00;
  pcVar6 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/node.cpp:317:9)>
           ::_M_manager;
  description._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/node.cpp:317:9)>
       ::_M_invoke;
  description._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/node.cpp:317:9)>
                ::_M_manager;
  description.field_2._M_allocated_capacity = (size_type)pRVar7;
  description.field_2._8_8_ = pRVar8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_fffffffffffffb90._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffffb90._8_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = pRVar9;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffbc8;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbb8._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffffbb8._8_8_;
  examples.m_examples.field_2._8_8_ = _Var10._M_p;
  local_370 = &local_360;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffffb58)),description,args,
             (RPCResults)in_stack_fffffffffffffba0,examples,(RPCMethodImpl *)&local_58);
  if (pcVar6 != (code *)0x0) {
    (*pcVar6)(&stack0xfffffffffffffb58,&stack0xfffffffffffffb58,3);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350,local_340 + 1);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370,local_360 + 1);
  }
  if (in_stack_fffffffffffffc10._M_p != &stack0xfffffffffffffc20) {
    operator_delete(in_stack_fffffffffffffc10._M_p,in_stack_fffffffffffffc20 + 1);
  }
  if (_Var10._M_p != &stack0xfffffffffffffbe0) {
    operator_delete(_Var10._M_p,in_stack_fffffffffffffbe0 + 1);
  }
  if (_Var11._M_p != &stack0xfffffffffffffc00) {
    operator_delete(_Var11._M_p,in_stack_fffffffffffffc00 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_cond._M_dataplus._M_p != &local_2f0.m_cond.field_2) {
    operator_delete(local_2f0.m_cond._M_dataplus._M_p,
                    local_2f0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_description._M_dataplus._M_p != &local_2f0.m_description.field_2) {
    operator_delete(local_2f0.m_description._M_dataplus._M_p,
                    local_2f0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2f0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_key_name._M_dataplus._M_p != &local_2f0.m_key_name.field_2) {
    operator_delete(local_2f0.m_key_name._M_dataplus._M_p,
                    local_2f0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb78);
  if (local_330[0] != local_320) {
    operator_delete(local_330[0],local_320[0] + 1);
  }
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffbb8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_opts.oneline_description._M_dataplus._M_p !=
      &local_180.m_opts.oneline_description.field_2) {
    operator_delete(local_180.m_opts.oneline_description._M_dataplus._M_p,
                    local_180.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_description._M_dataplus._M_p != &local_180.m_description.field_2) {
    operator_delete(local_180.m_description._M_dataplus._M_p,
                    local_180.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_180.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_names._M_dataplus._M_p != &local_180.m_names.field_2) {
    operator_delete(local_180.m_names._M_dataplus._M_p,
                    local_180.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_240);
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan echoipc()
{
    return RPCHelpMan{
        "echoipc",
        "\nEcho back the input argument, passing it through a spawned process in a multiprocess build.\n"
        "This command is for testing.\n",
        {{"arg", RPCArg::Type::STR, RPCArg::Optional::NO, "The string to echo",}},
        RPCResult{RPCResult::Type::STR, "echo", "The echoed string."},
        RPCExamples{HelpExampleCli("echo", "\"Hello world\"") +
                    HelpExampleRpc("echo", "\"Hello world\"")},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue {
            interfaces::Init& local_init = *EnsureAnyNodeContext(request.context).init;
            std::unique_ptr<interfaces::Echo> echo;
            if (interfaces::Ipc* ipc = local_init.ipc()) {
                // Spawn a new bitcoin-node process and call makeEcho to get a
                // client pointer to a interfaces::Echo instance running in
                // that process. This is just for testing. A slightly more
                // realistic test spawning a different executable instead of
                // the same executable would add a new bitcoin-echo executable,
                // and spawn bitcoin-echo below instead of bitcoin-node. But
                // using bitcoin-node avoids the need to build and install a
                // new executable just for this one test.
                auto init = ipc->spawnProcess("bitcoin-node");
                echo = init->makeEcho();
                ipc->addCleanup(*echo, [init = init.release()] { delete init; });
            } else {
                // IPC support is not available because this is a bitcoind
                // process not a bitcoind-node process, so just create a local
                // interfaces::Echo object and return it so the `echoipc` RPC
                // method will work, and the python test calling `echoipc`
                // can expect the same result.
                echo = local_init.makeEcho();
            }
            return echo->echo(request.params[0].get_str());
        },
    };
}